

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

char * ps_get_kws(ps_decoder_t *ps,char *name)

{
  ps_search_t *search_00;
  int iVar1;
  char *pcVar2;
  ps_search_t **val;
  void *search;
  ps_search_t *local_10;
  
  local_10 = (ps_search_t *)0x0;
  if (name == (char *)0x0) {
    val = &ps->search;
  }
  else {
    val = &local_10;
    hash_table_lookup(ps->searches,name,val);
  }
  search_00 = *val;
  if ((search_00 != (ps_search_t *)0x0) && (iVar1 = strcmp("kws",search_00->type), iVar1 == 0)) {
    pcVar2 = kws_search_get_keyphrases(search_00);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char*
ps_get_kws(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search = ps_find_search(ps, name);
    if (search == NULL)
        return NULL;
    if (0 != strcmp(PS_SEARCH_TYPE_KWS, ps_search_type(search)))
        return NULL;
    return kws_search_get_keyphrases(search);
}